

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDefs.cpp
# Opt level: O1

void glu::checkError(deUint32 err,char *msg,char *file,int line)

{
  ResourceError *this;
  size_t sVar1;
  ostringstream msgStr;
  Enum<int,_2UL> local_1c0 [2];
  ostream local_1a0;
  
  if (err == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,": ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"glGetError() returned ",0x16);
  local_1c0[0].m_getName = getErrorName;
  local_1c0[0].m_value = err;
  tcu::Format::Enum<int,_2UL>::toStream(local_1c0,&local_1a0);
  this = (ResourceError *)__cxa_allocate_exception(0x38);
  if (err == 0x505) {
    std::__cxx11::stringbuf::str();
    tcu::ResourceError::ResourceError(this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    *(undefined ***)&(this->super_TestException).super_Exception = &PTR__OutOfMemoryError_021c52d0;
    __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError((TestError *)this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  *(undefined ***)&(this->super_TestException).super_Exception = &PTR__Error_021c52a0;
  *(deUint32 *)&(this->super_TestException).field_0x34 = err;
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkError (deUint32 err, const char* msg, const char* file, int line)
{
	if (err != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << "glGetError() returned " << getErrorStr(err);

		if (err == GL_OUT_OF_MEMORY)
			throw OutOfMemoryError(msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, msgStr.str().c_str(), DE_NULL, file, line);
	}
}